

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_utils.c
# Opt level: O3

int cio_linux_socket_create(cio_address_family address_family)

{
  int __fd;
  int iVar1;
  int *piVar2;
  int iVar3;
  int yes;
  
  if (address_family == CIO_ADDRESS_FAMILY_UNSPEC) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    iVar3 = -1;
  }
  else {
    __fd = socket(address_family,0x80801,0);
    iVar3 = -1;
    if ((__fd != -1) && (iVar3 = __fd, address_family == CIO_ADDRESS_FAMILY_INET6)) {
      yes = 1;
      iVar1 = setsockopt(__fd,0x29,0x1a,&yes,4);
      if (iVar1 == -1) {
        close(__fd);
        iVar3 = -1;
      }
    }
  }
  return iVar3;
}

Assistant:

int cio_linux_socket_create(enum cio_address_family address_family)
{
	if (cio_unlikely(address_family == CIO_ADDRESS_FAMILY_UNSPEC)) {
		errno = EINVAL;
		return -1;
	}

	int domain = (int)address_family;

	int fd = socket(domain, (unsigned int)SOCK_STREAM | (unsigned int)SOCK_CLOEXEC | (unsigned int)SOCK_NONBLOCK, 0U);
	if (cio_unlikely(fd == -1)) {
		return -1;
	}

	if (address_family == CIO_ADDRESS_FAMILY_INET6) {
		int yes = 1;
		int ret = setsockopt(fd, IPPROTO_IPV6, IPV6_V6ONLY, (void *)&yes, sizeof(yes));
		if (cio_unlikely(ret == -1)) {
			close(fd);
			return -1;
		}
	}

	return fd;
}